

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

void __thiscall
icu_63::UnicodeString::UnicodeString
          (UnicodeString *this,UBool isTerminated,ConstChar16Ptr *textPtr,int32_t textLength)

{
  char16_t *s;
  int32_t local_6c;
  UChar *text;
  int32_t textLength_local;
  ConstChar16Ptr *textPtr_local;
  UBool isTerminated_local;
  UnicodeString *this_local;
  
  Replaceable::Replaceable(&this->super_Replaceable);
  (this->super_Replaceable).super_UObject._vptr_UObject = (_func_int **)&PTR__UnicodeString_00500b60
  ;
  (this->fUnion).fStackFields.fLengthAndFlags = 8;
  s = ConstChar16Ptr::operator_cast_to_char16_t_(textPtr);
  if (s == (char16_t *)0x0) {
    setToEmpty(this);
  }
  else if (((textLength < -1) || ((textLength == -1 && (isTerminated == '\0')))) ||
          ((-1 < textLength && ((isTerminated != '\0' && (s[textLength] != L'\0')))))) {
    setToBogus(this);
  }
  else {
    text._4_4_ = textLength;
    if (textLength == -1) {
      text._4_4_ = u_strlen_63(s);
    }
    if (isTerminated == '\0') {
      local_6c = text._4_4_;
    }
    else {
      local_6c = text._4_4_ + 1;
    }
    setArray(this,s,text._4_4_,local_6c);
  }
  return;
}

Assistant:

UnicodeString::UnicodeString(UBool isTerminated,
                             ConstChar16Ptr textPtr,
                             int32_t textLength) {
  fUnion.fFields.fLengthAndFlags = kReadonlyAlias;
  const UChar *text = textPtr;
  if(text == NULL) {
    // treat as an empty string, do not alias
    setToEmpty();
  } else if(textLength < -1 ||
            (textLength == -1 && !isTerminated) ||
            (textLength >= 0 && isTerminated && text[textLength] != 0)
  ) {
    setToBogus();
  } else {
    if(textLength == -1) {
      // text is terminated, or else it would have failed the above test
      textLength = u_strlen(text);
    }
    setArray(const_cast<UChar *>(text), textLength,
             isTerminated ? textLength + 1 : textLength);
  }
}